

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  ImVec2 IVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  undefined8 *puVar6;
  ImVec2 *pIVar7;
  ImVec2 *pIVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImVec2 IVar14;
  undefined8 uStackY_280;
  ImVec2 IStackY_278;
  ImVec2 local_270;
  undefined8 in_stack_fffffffffffffd98;
  ImDrawList *in_stack_fffffffffffffda0;
  uint local_220;
  int local_21c;
  int local_1ec;
  int local_1e8;
  float inv_len_1;
  float d2_3;
  float dy_1;
  float dx_1;
  ImVec2 *p2;
  ImVec2 *p1;
  int local_1b0;
  int i2_3;
  int i1_3;
  int vtx_count_1;
  int idx_count_1;
  int i_1;
  ImVec2 *out_vtx_1;
  float dm_in_y;
  float dm_in_x;
  float dm_out_y;
  float dm_out_x;
  float inv_lensq_1;
  float d2_2;
  float dm_y_1;
  float dm_x_1;
  uint idx2_1;
  int i2_2;
  int i1_2;
  uint idx1_1;
  int points_last;
  float half_inner_thickness;
  int i;
  ImVec2 *out_vtx;
  float inv_lensq;
  float d2_1;
  float dm_y;
  float dm_x;
  uint idx2;
  int i2_1;
  int i1_1;
  uint idx1;
  float inv_len;
  float d2;
  float dy;
  float dx;
  int i2;
  int i1;
  ImVec2 *temp_points;
  ImVec2 *temp_normals;
  int vtx_count;
  int idx_count;
  ImU32 col_trans;
  float AA_SIZE;
  bool thick_line;
  int count;
  ImVec2 opaque_uv;
  float thickness_local;
  bool closed_local;
  ImU32 col_local;
  int points_count_local;
  ImVec2 *points_local;
  ImDrawList *this_local;
  
  if (1 < points_count) {
    IVar1 = this->_Data->TexUvWhitePixel;
    AA_SIZE = (float)points_count;
    if (!closed) {
      AA_SIZE = (float)(points_count + -1);
    }
    bVar2 = 1.0 < thickness;
    iVar5 = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    if ((this->Flags & 1U) == 0) {
      uStackY_280 = 0x1fdde0;
      PrimReserve(in_stack_fffffffffffffda0,iVar5,(int)in_stack_fffffffffffffd98);
      for (local_1b0 = 0; local_1b0 < (int)AA_SIZE; local_1b0 = local_1b0 + 1) {
        if (local_1b0 + 1 == points_count) {
          IStackY_278.y = 0.0;
        }
        else {
          IStackY_278.y = (float)(local_1b0 + 1);
        }
        pIVar7 = points + local_1b0;
        pIVar8 = points + (int)IStackY_278.y;
        d2_3 = pIVar8->x - pIVar7->x;
        inv_len_1 = pIVar8->y - pIVar7->y;
        fVar9 = d2_3 * d2_3 + inv_len_1 * inv_len_1;
        if (0.0 < fVar9) {
          uStackY_280 = 0x1fdee9;
          fVar9 = sqrtf(fVar9);
          d2_3 = (1.0 / fVar9) * d2_3;
          inv_len_1 = (1.0 / fVar9) * inv_len_1;
        }
        fVar9 = thickness * 0.5 * d2_3;
        fVar10 = thickness * 0.5 * inv_len_1;
        (this->_VtxWritePtr->pos).x = pIVar7->x + fVar10;
        (this->_VtxWritePtr->pos).y = pIVar7->y - fVar9;
        this->_VtxWritePtr->uv = IVar1;
        this->_VtxWritePtr->col = col;
        this->_VtxWritePtr[1].pos.x = pIVar8->x + fVar10;
        this->_VtxWritePtr[1].pos.y = pIVar8->y - fVar9;
        this->_VtxWritePtr[1].uv = IVar1;
        this->_VtxWritePtr[1].col = col;
        this->_VtxWritePtr[2].pos.x = pIVar8->x - fVar10;
        this->_VtxWritePtr[2].pos.y = pIVar8->y + fVar9;
        this->_VtxWritePtr[2].uv = IVar1;
        this->_VtxWritePtr[2].col = col;
        this->_VtxWritePtr[3].pos.x = pIVar7->x - fVar10;
        this->_VtxWritePtr[3].pos.y = pIVar7->y + fVar9;
        this->_VtxWritePtr[3].uv = IVar1;
        this->_VtxWritePtr[3].col = col;
        this->_VtxWritePtr = this->_VtxWritePtr + 4;
        *this->_IdxWritePtr = this->_VtxCurrentIdx;
        this->_IdxWritePtr[1] = this->_VtxCurrentIdx + 1;
        this->_IdxWritePtr[2] = this->_VtxCurrentIdx + 2;
        this->_IdxWritePtr[3] = this->_VtxCurrentIdx;
        this->_IdxWritePtr[4] = this->_VtxCurrentIdx + 2;
        this->_IdxWritePtr[5] = this->_VtxCurrentIdx + 3;
        this->_IdxWritePtr = this->_IdxWritePtr + 6;
        this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
      }
    }
    else {
      uVar4 = col & 0xffffff;
      if (bVar2) {
        local_1e8 = points_count << 2;
      }
      else {
        local_1e8 = points_count * 3;
      }
      uStackY_280 = 0x1fcd38;
      PrimReserve(in_stack_fffffffffffffda0,iVar5,(int)in_stack_fffffffffffffd98);
      lVar3 = -((long)(int)(points_count * ((uint)bVar2 * 2 + 3)) * 8 + 0xfU & 0xfffffffffffffff0);
      puVar6 = (undefined8 *)((long)&IStackY_278 + lVar3);
      pIVar7 = (ImVec2 *)(puVar6 + points_count);
      for (dx = 0.0; (int)dx < (int)AA_SIZE; dx = (float)((int)dx + 1)) {
        if ((int)dx + 1 == points_count) {
          local_1ec = 0;
        }
        else {
          local_1ec = (int)dx + 1;
        }
        d2 = points[local_1ec].x - points[(int)dx].x;
        inv_len = points[local_1ec].y - points[(int)dx].y;
        fVar9 = d2 * d2 + inv_len * inv_len;
        if (0.0 < fVar9) {
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fce2e;
          fVar9 = sqrtf(fVar9);
          d2 = (1.0 / fVar9) * d2;
          inv_len = (1.0 / fVar9) * inv_len;
        }
        *(float *)(puVar6 + (int)dx) = inv_len;
        *(float *)((long)&IStackY_278 + (long)(int)dx * 8 + lVar3 + 4) = -d2;
      }
      if (!closed) {
        puVar6[points_count + -1] = puVar6[points_count + -2];
      }
      if (bVar2) {
        fVar9 = (thickness - 1.0) * 0.5;
        if (!closed) {
          iVar5 = points_count + -1;
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd4fb;
          ::operator*((ImVec2 *)*puVar6,*(float *)((long)&uStackY_280 + lVar3 + 4));
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd516;
          IVar14 = operator+((ImVec2 *)*puVar6,*(ImVec2 **)((long)&uStackY_280 + lVar3));
          *pIVar7 = IVar14;
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd548;
          ::operator*((ImVec2 *)*puVar6,*(float *)((long)&uStackY_280 + lVar3 + 4));
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd563;
          IVar14 = operator+((ImVec2 *)*puVar6,*(ImVec2 **)((long)&uStackY_280 + lVar3));
          pIVar7[1] = IVar14;
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd596;
          ::operator*((ImVec2 *)*puVar6,*(float *)((long)&uStackY_280 + lVar3 + 4));
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd5b1;
          IVar14 = ::operator-((ImVec2 *)*puVar6,*(ImVec2 **)((long)&uStackY_280 + lVar3));
          pIVar7[2] = IVar14;
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd5f0;
          ::operator*((ImVec2 *)*puVar6,*(float *)((long)&uStackY_280 + lVar3 + 4));
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd60b;
          IVar14 = ::operator-((ImVec2 *)*puVar6,*(ImVec2 **)((long)&uStackY_280 + lVar3));
          pIVar7[3] = IVar14;
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd659;
          ::operator*((ImVec2 *)*puVar6,*(float *)((long)&uStackY_280 + lVar3 + 4));
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd674;
          IVar14 = operator+((ImVec2 *)*puVar6,*(ImVec2 **)((long)&uStackY_280 + lVar3));
          pIVar7[iVar5 * 4] = IVar14;
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd6c2;
          ::operator*((ImVec2 *)*puVar6,*(float *)((long)&uStackY_280 + lVar3 + 4));
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd6dd;
          IVar14 = operator+((ImVec2 *)*puVar6,*(ImVec2 **)((long)&uStackY_280 + lVar3));
          pIVar7[(long)(iVar5 * 4) + 1] = IVar14;
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd72c;
          ::operator*((ImVec2 *)*puVar6,*(float *)((long)&uStackY_280 + lVar3 + 4));
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd747;
          IVar14 = ::operator-((ImVec2 *)*puVar6,*(ImVec2 **)((long)&uStackY_280 + lVar3));
          pIVar7[(long)(iVar5 * 4) + 2] = IVar14;
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd7a2;
          ::operator*((ImVec2 *)*puVar6,*(float *)((long)&uStackY_280 + lVar3 + 4));
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd7bd;
          IVar14 = ::operator-((ImVec2 *)*puVar6,*(ImVec2 **)((long)&uStackY_280 + lVar3));
          pIVar7[iVar5 * 4 + 3] = IVar14;
        }
        i2_2 = this->_VtxCurrentIdx;
        for (idx2_1 = 0; (int)idx2_1 < (int)AA_SIZE; idx2_1 = idx2_1 + 1) {
          if (idx2_1 + 1 == points_count) {
            local_270.y = 0.0;
          }
          else {
            local_270.y = (float)(idx2_1 + 1);
          }
          if (idx2_1 + 1 == points_count) {
            local_270.x = (float)this->_VtxCurrentIdx;
          }
          else {
            local_270.x = (float)(i2_2 + 4);
          }
          fVar10 = (*(float *)(puVar6 + (int)idx2_1) + *(float *)(puVar6 + (int)local_270.y)) * 0.5;
          fVar11 = (*(float *)((long)&IStackY_278 + (long)(int)idx2_1 * 8 + lVar3 + 4) +
                   *(float *)((long)&IStackY_278 + (long)(int)local_270.y * 8 + lVar3 + 4)) * 0.5;
          dm_out_x = fVar10 * fVar10 + fVar11 * fVar11;
          if (dm_out_x < 0.5) {
            dm_out_x = 0.5;
          }
          fVar10 = (1.0 / dm_out_x) * fVar10;
          fVar11 = (1.0 / dm_out_x) * fVar11;
          fVar12 = fVar10 * (fVar9 + 1.0);
          fVar13 = fVar11 * (fVar9 + 1.0);
          fVar10 = fVar10 * fVar9;
          fVar11 = fVar11 * fVar9;
          pIVar8 = pIVar7 + ((int)local_270.y << 2);
          pIVar8->x = points[(int)local_270.y].x + fVar12;
          pIVar8->y = points[(int)local_270.y].y + fVar13;
          pIVar8[1].x = points[(int)local_270.y].x + fVar10;
          pIVar8[1].y = points[(int)local_270.y].y + fVar11;
          pIVar8[2].x = points[(int)local_270.y].x - fVar10;
          pIVar8[2].y = points[(int)local_270.y].y - fVar11;
          pIVar8[3].x = points[(int)local_270.y].x - fVar12;
          pIVar8[3].y = points[(int)local_270.y].y - fVar13;
          *this->_IdxWritePtr = (int)local_270.x + 1;
          this->_IdxWritePtr[1] = i2_2 + 1;
          this->_IdxWritePtr[2] = i2_2 + 2;
          this->_IdxWritePtr[3] = i2_2 + 2;
          this->_IdxWritePtr[4] = (int)local_270.x + 2;
          this->_IdxWritePtr[5] = (int)local_270.x + 1;
          this->_IdxWritePtr[6] = (int)local_270.x + 1;
          this->_IdxWritePtr[7] = i2_2 + 1;
          this->_IdxWritePtr[8] = i2_2;
          this->_IdxWritePtr[9] = i2_2;
          this->_IdxWritePtr[10] = (uint)local_270.x;
          this->_IdxWritePtr[0xb] = (int)local_270.x + 1;
          this->_IdxWritePtr[0xc] = (int)local_270.x + 2;
          this->_IdxWritePtr[0xd] = i2_2 + 2;
          this->_IdxWritePtr[0xe] = i2_2 + 3;
          this->_IdxWritePtr[0xf] = i2_2 + 3;
          this->_IdxWritePtr[0x10] = (int)local_270.x + 3;
          this->_IdxWritePtr[0x11] = (int)local_270.x + 2;
          this->_IdxWritePtr = this->_IdxWritePtr + 0x12;
          i2_2 = (int)local_270.x;
        }
        for (vtx_count_1 = 0; vtx_count_1 < points_count; vtx_count_1 = vtx_count_1 + 1) {
          this->_VtxWritePtr->pos = pIVar7[vtx_count_1 << 2];
          this->_VtxWritePtr->uv = IVar1;
          this->_VtxWritePtr->col = uVar4;
          this->_VtxWritePtr[1].pos = pIVar7[vtx_count_1 * 4 + 1];
          this->_VtxWritePtr[1].uv = IVar1;
          this->_VtxWritePtr[1].col = col;
          this->_VtxWritePtr[2].pos = pIVar7[vtx_count_1 * 4 + 2];
          this->_VtxWritePtr[2].uv = IVar1;
          this->_VtxWritePtr[2].col = col;
          this->_VtxWritePtr[3].pos = pIVar7[vtx_count_1 * 4 + 3];
          this->_VtxWritePtr[3].uv = IVar1;
          this->_VtxWritePtr[3].col = uVar4;
          this->_VtxWritePtr = this->_VtxWritePtr + 4;
        }
      }
      else {
        if (!closed) {
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fcf02;
          ::operator*((ImVec2 *)*puVar6,*(float *)((long)&uStackY_280 + lVar3 + 4));
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fcf17;
          IVar14 = operator+((ImVec2 *)*puVar6,*(ImVec2 **)((long)&uStackY_280 + lVar3));
          *pIVar7 = IVar14;
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fcf46;
          ::operator*((ImVec2 *)*puVar6,*(float *)((long)&uStackY_280 + lVar3 + 4));
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fcf61;
          IVar14 = ::operator-((ImVec2 *)*puVar6,*(ImVec2 **)((long)&uStackY_280 + lVar3));
          pIVar7[1] = IVar14;
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fcfa1;
          ::operator*((ImVec2 *)*puVar6,*(float *)((long)&uStackY_280 + lVar3 + 4));
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fcfbc;
          IVar14 = operator+((ImVec2 *)*puVar6,*(ImVec2 **)((long)&uStackY_280 + lVar3));
          pIVar7[points_count * 2 + -2] = IVar14;
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd00e;
          ::operator*((ImVec2 *)*puVar6,*(float *)((long)&uStackY_280 + lVar3 + 4));
          *(undefined8 *)((long)&uStackY_280 + lVar3) = 0x1fd029;
          IVar14 = ::operator-((ImVec2 *)*puVar6,*(ImVec2 **)((long)&uStackY_280 + lVar3));
          pIVar7[(points_count + -1) * 2 + 1] = IVar14;
        }
        i2_1 = this->_VtxCurrentIdx;
        for (idx2 = 0; (int)idx2 < (int)AA_SIZE; idx2 = idx2 + 1) {
          if (idx2 + 1 == points_count) {
            local_21c = 0;
          }
          else {
            local_21c = idx2 + 1;
          }
          if (idx2 + 1 == points_count) {
            local_220 = this->_VtxCurrentIdx;
          }
          else {
            local_220 = i2_1 + 3;
          }
          fVar9 = (*(float *)(puVar6 + (int)idx2) + *(float *)(puVar6 + local_21c)) * 0.5;
          fVar10 = (*(float *)((long)&IStackY_278 + (long)(int)idx2 * 8 + lVar3 + 4) +
                   *(float *)((long)&IStackY_278 + (long)local_21c * 8 + lVar3 + 4)) * 0.5;
          out_vtx._4_4_ = fVar9 * fVar9 + fVar10 * fVar10;
          if (out_vtx._4_4_ < 0.5) {
            out_vtx._4_4_ = 0.5;
          }
          fVar9 = (1.0 / out_vtx._4_4_) * fVar9 * 1.0;
          fVar10 = (1.0 / out_vtx._4_4_) * fVar10 * 1.0;
          pIVar8 = pIVar7 + (local_21c << 1);
          pIVar8->x = points[local_21c].x + fVar9;
          pIVar8->y = points[local_21c].y + fVar10;
          pIVar8[1].x = points[local_21c].x - fVar9;
          pIVar8[1].y = points[local_21c].y - fVar10;
          *this->_IdxWritePtr = local_220;
          this->_IdxWritePtr[1] = i2_1;
          this->_IdxWritePtr[2] = i2_1 + 2;
          this->_IdxWritePtr[3] = i2_1 + 2;
          this->_IdxWritePtr[4] = local_220 + 2;
          this->_IdxWritePtr[5] = local_220;
          this->_IdxWritePtr[6] = local_220 + 1;
          this->_IdxWritePtr[7] = i2_1 + 1;
          this->_IdxWritePtr[8] = i2_1;
          this->_IdxWritePtr[9] = i2_1;
          this->_IdxWritePtr[10] = local_220;
          this->_IdxWritePtr[0xb] = local_220 + 1;
          this->_IdxWritePtr = this->_IdxWritePtr + 0xc;
          i2_1 = local_220;
        }
        for (points_last = 0; points_last < points_count; points_last = points_last + 1) {
          this->_VtxWritePtr->pos = points[points_last];
          this->_VtxWritePtr->uv = IVar1;
          this->_VtxWritePtr->col = col;
          this->_VtxWritePtr[1].pos = pIVar7[points_last << 1];
          this->_VtxWritePtr[1].uv = IVar1;
          this->_VtxWritePtr[1].col = uVar4;
          this->_VtxWritePtr[2].pos = pIVar7[points_last * 2 + 1];
          this->_VtxWritePtr[2].uv = IVar1;
          this->_VtxWritePtr[2].col = uVar4;
          this->_VtxWritePtr = this->_VtxWritePtr + 3;
        }
      }
      this->_VtxCurrentIdx = local_1e8 + this->_VtxCurrentIdx;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = (thickness > 1.0f);
    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= AA_SIZE;
                dm_y *= AA_SIZE;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2*2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2*4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}